

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void print_code(vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>
                *v,vector<ErrorInfoException,_std::allocator<ErrorInfoException>_> *errors)

{
  bool bVar1;
  int iVar2;
  __shared_ptr_access<StringLine,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this;
  enableStd<rang::fg> pbVar3;
  element_type *peVar4;
  ostream *os;
  ulong uVar5;
  string *psVar6;
  char *pcVar7;
  int local_44;
  int column;
  int i;
  shared_ptr<StringLine> *it;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_> *__range1;
  __normal_iterator<const_ErrorInfoException_*,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
  eit;
  vector<ErrorInfoException,_std::allocator<ErrorInfoException>_> *errors_local;
  vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_> *v_local;
  
  eit._M_current = (ErrorInfoException *)errors;
  system("clear");
  __range1 = (vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_> *)
             std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>::begin
                       ((vector<ErrorInfoException,_std::allocator<ErrorInfoException>_> *)
                        eit._M_current);
  __end1 = std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>::
           begin(v);
  it = (shared_ptr<StringLine> *)
       std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>::end
                 (v);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::shared_ptr<StringLine>_*,_std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>_>
                                *)&it);
    if (!bVar1) break;
    this = (__shared_ptr_access<StringLine,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           __gnu_cxx::
           __normal_iterator<const_std::shared_ptr<StringLine>_*,_std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>_>
           ::operator*(&__end1);
    pbVar3 = rang::operator<<((ostream *)&std::cout,yellow);
    peVar4 = std::__shared_ptr_access<StringLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this);
    iVar2 = StringLine::get_line(peVar4);
    os = (ostream *)std::ostream::operator<<(pbVar3,iVar2);
    pbVar3 = rang::operator<<(os,reset);
    std::operator<<(pbVar3,": ");
    local_44 = 0;
    while( true ) {
      peVar4 = std::__shared_ptr_access<StringLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this);
      StringLine::get_text_abi_cxx11_(peVar4);
      uVar5 = std::__cxx11::string::size();
      if (uVar5 <= (ulong)(long)local_44) break;
      print_error_color((__normal_iterator<const_ErrorInfoException_*,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
                         *)&__range1,
                        (vector<ErrorInfoException,_std::allocator<ErrorInfoException>_> *)
                        eit._M_current,(shared_ptr<StringLine> *)this,local_44 + 1);
      peVar4 = std::__shared_ptr_access<StringLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this);
      psVar6 = StringLine::get_text_abi_cxx11_(peVar4);
      pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)psVar6);
      std::operator<<((ostream *)&std::cout,*pcVar7);
      local_44 = local_44 + 1;
    }
    reset_error_color((__normal_iterator<const_ErrorInfoException_*,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
                       *)&__range1,
                      (vector<ErrorInfoException,_std::allocator<ErrorInfoException>_> *)
                      eit._M_current);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<StringLine>_*,_std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void print_code(const vector<shared_ptr<StringLine>> &v, const vector<ErrorInfoException> &errors) {
    system("clear");
    __gnu_cxx::__normal_iterator<const ErrorInfoException *, vector<ErrorInfoException, allocator<ErrorInfoException>>> eit = errors.begin();
    for (const auto &it : v) {
        cout << fg::yellow << it->get_line() << fg::reset << ": ";
        for (int i = 0; i < it->get_text().size(); ++i) {
            int column = i + 1;
            print_error_color(eit, errors, it, column);
            cout << it->get_text()[i];
        }
        reset_error_color(eit, errors);
    }
}